

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O3

bool __thiscall
cmLoadCacheCommand::InitialPass
          (cmLoadCacheCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  int iVar2;
  cmake *this_00;
  pointer pbVar3;
  string *arg;
  pointer __v;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  excludes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  undefined1 local_90 [32];
  _Base_ptr local_70;
  size_t local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  __v = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__v == pbVar3) {
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"called with wrong number of arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_90);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
    __v = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (0x20 < (ulong)((long)pbVar3 - (long)__v)) {
    iVar2 = std::__cxx11::string::compare((char *)(__v + 1));
    if (iVar2 == 0) {
      bVar1 = ReadWithPrefix(this,args);
      return bVar1;
    }
    __v = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_90._24_8_ = local_90 + 8;
  local_90._8_4_ = _S_red;
  local_90._16_8_ = 0;
  local_68 = 0;
  local_70 = (_Base_ptr)local_90._24_8_;
  if (__v != pbVar3) {
    bVar1 = false;
    do {
      if (bVar1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_90,__v);
      }
      iVar2 = std::__cxx11::string::compare((char *)__v);
      if (iVar2 == 0) {
        bVar1 = true;
      }
    } while (((!bVar1) || (iVar2 = std::__cxx11::string::compare((char *)__v), iVar2 != 0)) &&
            (__v = __v + 1, __v != pbVar3));
    __v = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__v != pbVar3) {
    bVar1 = false;
    do {
      if (bVar1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,__v);
      }
      iVar2 = std::__cxx11::string::compare((char *)__v);
      if (iVar2 == 0) {
        bVar1 = true;
      }
    } while (((!bVar1) || (iVar2 = std::__cxx11::string::compare((char *)__v), iVar2 != 0)) &&
            (__v = __v + 1, __v != pbVar3));
    __v = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (__v != pbVar3) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)__v);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)__v), iVar2 == 0)) break;
      this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::LoadCache(this_00,__v,false,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_90,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_60);
      __v = __v + 1;
    } while (__v != pbVar3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  return true;
}

Assistant:

bool cmLoadCacheCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with wrong number of arguments.");
  }

  if (args.size() >= 2 && args[1] == "READ_WITH_PREFIX") {
    return this->ReadWithPrefix(args);
  }

  // Cache entries to be excluded from the import list.
  // If this set is empty, all cache entries are brought in
  // and they can not be overridden.
  bool excludeFiles = false;
  std::set<std::string> excludes;

  for (std::string const& arg : args) {
    if (excludeFiles) {
      excludes.insert(arg);
    }
    if (arg == "EXCLUDE") {
      excludeFiles = true;
    }
    if (excludeFiles && (arg == "INCLUDE_INTERNALS")) {
      break;
    }
  }

  // Internal cache entries to be imported.
  // If this set is empty, no internal cache entries are
  // brought in.
  bool includeFiles = false;
  std::set<std::string> includes;

  for (std::string const& arg : args) {
    if (includeFiles) {
      includes.insert(arg);
    }
    if (arg == "INCLUDE_INTERNALS") {
      includeFiles = true;
    }
    if (includeFiles && (arg == "EXCLUDE")) {
      break;
    }
  }

  // Loop over each build directory listed in the arguments.  Each
  // directory has a cache file.
  for (std::string const& arg : args) {
    if ((arg == "EXCLUDE") || (arg == "INCLUDE_INTERNALS")) {
      break;
    }
    this->Makefile->GetCMakeInstance()->LoadCache(arg, false, excludes,
                                                  includes);
  }

  return true;
}